

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O3

int GetCombinedHistogramEntropy
              (VP8LHistogram *a,VP8LHistogram *b,int64_t cost_threshold_in,uint64_t *cost,
              uint64_t *costs)

{
  uint64_t uVar1;
  int iVar2;
  uint64_t uVar3;
  uint64_t cost_threshold;
  ulong uVar4;
  bool bVar5;
  VP8LBitEntropy bit_entropy;
  VP8LStreaks stats;
  
  if (cost_threshold_in < 1) {
    return 0;
  }
  *cost = 0;
  uVar4 = 0;
  while( true ) {
    if (a->trivial_symbol[uVar4] == 0xffff) {
      bVar5 = true;
    }
    else {
      bVar5 = a->trivial_symbol[uVar4] != b->trivial_symbol[uVar4];
    }
    if (((bVar5) && (a->is_used[uVar4] != '\0')) && (b->is_used[uVar4] != '\0')) {
      iVar2 = (*(code *)((long)&DAT_001b89ec + (long)(int)(&DAT_001b89ec)[uVar4 & 0xffffffff]))
                        (a,b,0x100);
      return iVar2;
    }
    if (a->is_used[uVar4] == '\0') {
      uVar3 = b->costs[uVar4];
    }
    else {
      uVar3 = a->costs[uVar4];
    }
    costs[uVar4] = uVar3;
    uVar1 = *cost;
    *cost = uVar3 + uVar1;
    if ((ulong)cost_threshold_in <= uVar3 + uVar1) break;
    uVar4 = uVar4 + 1;
    if (uVar4 == 5) {
      return 1;
    }
  }
  return 0;
}

Assistant:

WEBP_NODISCARD static int GetCombinedHistogramEntropy(
    const VP8LHistogram* const a, const VP8LHistogram* const b,
    int64_t cost_threshold_in, uint64_t* cost, uint64_t costs[5]) {
  int i;
  const uint64_t cost_threshold = (uint64_t)cost_threshold_in;
  assert(a->palette_code_bits == b->palette_code_bits);
  if (cost_threshold_in <= 0) return 0;
  *cost = 0;

  // No need to add the extra cost for length and distance as it is a constant
  // that does not influence the histograms.
  for (i = 0; i < 5; ++i) {
    costs[i] = GetCombinedEntropy(a, b, (HistogramIndex)i);
    *cost += costs[i];
    if (*cost >= cost_threshold) return 0;
  }

  return 1;
}